

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_wbl.c
# Opt level: O0

void beltWBLStepE(void *buf,size_t count,void *state)

{
  long in_RDX;
  void *in_RSI;
  size_t in_RDI;
  void *unaff_retaddr;
  belt_wbl_st *st;
  
  *(undefined8 *)(in_RDX + 0x40) = 0;
  if ((((ulong)in_RSI & 0xf) == 0) && ((void *)0x3f < in_RSI)) {
    beltWBLStepEOpt(buf,count,state);
  }
  else {
    beltWBLStepEBase(unaff_retaddr,in_RDI,in_RSI);
  }
  return;
}

Assistant:

void beltWBLStepE(void* buf, size_t count, void* state)
{
	belt_wbl_st* st = (belt_wbl_st*)state;
	ASSERT(memIsValid(state, beltWBL_keep()));
	st->round = 0;
	(count % 16 || count < 64) ? 
		beltWBLStepEBase(buf, count, state) :
		beltWBLStepEOpt(buf, count, state);
}